

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_ml_literal_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  size_type __n;
  basic_value<toml::type_config> *v;
  string_format_info fmt;
  basic_value<toml::type_config> *ctx_00;
  string str;
  string_type val;
  region reg;
  location first;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string_type local_3f8;
  string local_3d8;
  string local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  region local_378;
  undefined1 local_310 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  undefined8 local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_260;
  region_type local_248;
  location local_1e0;
  location local_198;
  basic_value<toml::type_config> local_150;
  failure<toml::error_info> local_88;
  
  location::location(&local_198,loc);
  syntax::ml_literal_string((sequence *)local_310,&ctx->toml_spec_);
  sequence::scan(&local_378,(sequence *)local_310,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_310 + 8));
  if (local_378.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b8,"toml::parse_ml_literal_string: invalid string format","");
    syntax::ml_literal_string((sequence *)local_438,&ctx->toml_spec_);
    location::location(&local_1e0,loc);
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_310,&local_3b8,(sequence *)local_438,&local_1e0,&local_3d8);
    err<toml::error_info>(&local_88,(error_info *)local_310);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8 != local_2c8) {
      operator_delete((void *)local_2d8,local_2c8[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._0_8_ != &local_300) {
      operator_delete((void *)local_310._0_8_,(ulong)(local_300._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_1e0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_438 + 8));
    local_438._0_8_ = local_3b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p == &local_3b8.field_2) goto LAB_003eba1d;
  }
  else {
    puVar2 = ((local_378.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_438,(detail *)(puVar2 + local_378.first_),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + local_378.last_),in_RCX);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,0,3);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               (size_type)
               ((long)&(((pointer)(local_438._8_8_ + -8))->scanner_)._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 5)
               ,3);
    if ((((pointer)local_438._8_8_ != (pointer)0x0) && (__n = 1, *(char *)local_438._0_8_ == '\n'))
       || ((fmt.fmt = multiline_literal, fmt.start_with_newline = false,
           (pointer)0x1 < (ulong)local_438._8_8_ &&
           ((*(char *)local_438._0_8_ == '\r' && (__n = 2, *(char *)(local_438._0_8_ + 1) == '\n')))
           ))) {
      fmt.fmt = multiline_literal;
      fmt.start_with_newline = true;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,0,
                 __n);
    }
    local_418 = &local_408;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_418,local_438._0_8_,
               (char *)(local_438._0_8_ +
                       (long)(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                              *)local_438._8_8_));
    if (local_418 == &local_408) {
      local_3f8.field_2._8_8_ = local_408._8_8_;
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    }
    else {
      local_3f8._M_dataplus._M_p = (pointer)local_418;
    }
    local_3f8.field_2._M_allocated_capacity._1_7_ = local_408._M_allocated_capacity._1_7_;
    local_3f8.field_2._M_local_buf[0] = local_408._M_local_buf[0];
    local_3f8._M_string_length = local_410;
    local_410 = 0;
    local_408._M_local_buf[0] = '\0';
    local_398.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_398.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_378.source_name_.field_2;
    local_248.source_name_._M_dataplus._M_p = (pointer)&local_248.source_name_.field_2;
    local_248.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_378.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_248.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_378.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_378.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_378.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378.source_name_._M_dataplus._M_p == paVar1) {
      local_248.source_name_.field_2._8_8_ = local_378.source_name_.field_2._8_8_;
    }
    else {
      local_248.source_name_._M_dataplus._M_p = local_378.source_name_._M_dataplus._M_p;
    }
    local_248.source_name_._M_string_length = local_378.source_name_._M_string_length;
    local_378.source_name_._M_string_length = 0;
    local_378.source_name_.field_2._M_local_buf[0] = '\0';
    local_248.length_ = local_378.length_;
    local_248.first_ = local_378.first_;
    local_248.first_line_ = local_378.first_line_;
    local_248.first_column_ = local_378.first_column_;
    local_248.last_ = local_378.last_;
    local_248.last_line_ = local_378.last_line_;
    local_248.last_column_ = local_378.last_column_;
    local_418 = &local_408;
    local_378.source_name_._M_dataplus._M_p = (pointer)paVar1;
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_310,&local_3f8,fmt,&local_398,&local_248);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_150,(toml *)local_310,v);
    __return_storage_ptr__->is_ok_ = true;
    ctx_00 = &local_150;
    basic_value<toml::type_config>::basic_value
              (&(__return_storage_ptr__->field_1).succ_.value,&local_150);
    basic_value<toml::type_config>::cleanup(&local_150,(EVP_PKEY_CTX *)ctx_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_150.comments_.comments);
    region::~region(&local_150.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_310,(EVP_PKEY_CTX *)ctx_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_260);
    region::~region((region *)local_2c8);
    region::~region(&local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,
                      CONCAT71(local_408._M_allocated_capacity._1_7_,local_408._M_local_buf[0]) + 1)
      ;
    }
    local_3b8.field_2._M_allocated_capacity = local_428._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ == &local_428) goto LAB_003eba1d;
  }
  operator_delete((void *)local_438._0_8_,local_3b8.field_2._M_allocated_capacity + 1);
LAB_003eba1d:
  region::~region(&local_378);
  location::~location(&local_198);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_ml_literal_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    string_format_info fmt;
    fmt.fmt = string_format::multiline_literal;

    auto reg = syntax::ml_literal_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_ml_literal_string: "
            "invalid string format",
            syntax::ml_literal_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.substr(0, 3) == "'''");
    assert(str.substr(str.size()-3, 3) == "'''");
    str.erase(0, 3);
    str.erase(str.size()-3, 3);

    // the first newline just after """ is trimmed
    if(str.size() >= 1 && str.at(0) == '\n')
    {
        str.erase(0, 1);
        fmt.start_with_newline = true;
    }
    else if(str.size() >= 2 && str.at(0) == '\r' && str.at(1) == '\n')
    {
        str.erase(0, 2);
        fmt.start_with_newline = true;
    }

    using string_type = typename basic_value<TC>::string_type;
    string_type val(str.begin(), str.end());

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}